

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-io.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  reference piVar1;
  file *this;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  void *this_00;
  BOV *this_01;
  ulong uVar5;
  DiscreteBounds *bounds;
  vector<float,_std::allocator<float>_> *this_02;
  DiscreteBounds sub_box;
  DiscreteBounds full_box;
  NumPy writer;
  file out;
  uint i_1;
  vector<float,_std::allocator<float>_> data2;
  NumPy reader2;
  file in2;
  uint i;
  vector<float,_std::allocator<float>_> data;
  BOV reader;
  file in;
  DiscreteBounds box;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shape;
  communicator world;
  environment env;
  undefined4 in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  undefined8 in_stack_fffffffffffffb68;
  Bounds<int> *in_stack_fffffffffffffb70;
  size_type in_stack_fffffffffffffb78;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb80;
  file *in_stack_fffffffffffffb88;
  BOV *in_stack_fffffffffffffb90;
  char *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  int dim;
  NumPy *in_stack_fffffffffffffbb0;
  DiscreteBounds *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined4 uVar6;
  float *buffer;
  DiscreteBounds *bounds_00;
  undefined8 in_stack_fffffffffffffbe8;
  int iVar7;
  int mode;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  undefined4 uVar8;
  communicator *in_stack_fffffffffffffbf8;
  communicator *comm__;
  file *in_stack_fffffffffffffc00;
  allocator<char> local_279;
  string local_278 [64];
  uint local_238;
  undefined1 local_231 [104];
  undefined1 local_1c9 [65];
  uint local_188;
  undefined1 local_181 [96];
  allocator<char> local_121;
  string local_120 [192];
  undefined4 local_60;
  undefined4 local_5c;
  int local_4;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  local_4 = 0;
  diy::mpi::environment::environment
            ((environment *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             in_stack_fffffffffffffb5c,(char **)0x10a03d);
  diy::mpi::communicator::communicator
            ((communicator *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10a061);
  local_5c = 0x10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  local_60 = 0x10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  diy::Bounds<int>::Bounds
            (in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *piVar1 = 4;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *piVar1 = 4;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *piVar1 = 7;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *piVar1 = 7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (allocator<char> *)in_stack_fffffffffffffb90);
  diy::mpi::io::file::file
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
             (string *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),iVar7);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  diy::io::BOV::BOV<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78);
  this = (file *)std::operator<<((ostream *)&std::cout,"Reading");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  comm__ = (communicator *)local_181;
  std::allocator<float>::allocator((allocator<float> *)0x10a23b);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
             (allocator_type *)in_stack_fffffffffffffb70);
  std::allocator<float>::~allocator((allocator<float> *)0x10a264);
  uVar8 = 0;
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)(local_181 + 1),0);
  diy::io::BOV::read<float>
            ((BOV *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8,(float *)in_stack_fffffffffffffbb0,
             SUB81((ulong)in_stack_fffffffffffffba8 >> 0x38,0),(int)in_stack_fffffffffffffba8);
  local_188 = 0;
  while( true ) {
    uVar2 = (ulong)local_188;
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(local_181 + 1));
    if (sVar3 <= uVar2) break;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_181 + 1),(ulong)local_188);
    this_00 = (void *)std::ostream::operator<<(&std::cout,*pvVar4);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_188 = local_188 + 1;
  }
  this_01 = (BOV *)std::operator<<((ostream *)&std::cout,"---");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  bounds_00 = (DiscreteBounds *)local_1c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (allocator<char> *)in_stack_fffffffffffffb90);
  diy::mpi::io::file::file
            (this,comm__,(string *)CONCAT44(uVar8,in_stack_fffffffffffffbf0),(int)(uVar2 >> 0x20));
  std::__cxx11::string::~string((string *)(local_1c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1c9);
  diy::io::NumPy::NumPy
            ((NumPy *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (file *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  diy::io::NumPy::read_header(in_stack_fffffffffffffbb0);
  buffer = (float *)local_231;
  std::allocator<float>::allocator((allocator<float> *)0x10a517);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
             (allocator_type *)in_stack_fffffffffffffb70);
  std::allocator<float>::~allocator((allocator<float> *)0x10a53d);
  uVar6 = 0;
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)(local_231 + 1),0);
  diy::io::BOV::read<float>
            ((BOV *)CONCAT44(uVar6,in_stack_fffffffffffffbc0),in_stack_fffffffffffffbb8,
             (float *)in_stack_fffffffffffffbb0,SUB81((ulong)in_stack_fffffffffffffba8 >> 0x38,0),
             (int)in_stack_fffffffffffffba8);
  local_238 = 0;
  while( true ) {
    uVar5 = (ulong)local_238;
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(local_231 + 1));
    mode = (int)(uVar2 >> 0x20);
    iVar7 = (int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
    if (sVar3 <= uVar5) break;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_231 + 1),(ulong)local_238);
    in_stack_fffffffffffffbb0 = (NumPy *)std::ostream::operator<<(&std::cout,*pvVar4);
    std::ostream::operator<<(in_stack_fffffffffffffbb0,std::endl<char,std::char_traits<char>>);
    local_238 = local_238 + 1;
  }
  dim = (int)((ulong)&local_279 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (allocator<char> *)in_stack_fffffffffffffb90);
  diy::mpi::io::file::file(this,comm__,(string *)CONCAT44(uVar8,in_stack_fffffffffffffbf0),mode);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  diy::io::NumPy::NumPy
            ((NumPy *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (file *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  diy::Bounds<int>::Bounds(in_stack_fffffffffffffb70,iVar7);
  diy::Bounds<int>::Bounds(in_stack_fffffffffffffb70,iVar7);
  bounds = (DiscreteBounds *)
           itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *(int *)&(bounds->min).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_> = 0;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *piVar1 = 0;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *piVar1 = 3;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *piVar1 = 3;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *piVar1 = 1;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *piVar1 = 1;
  this_02 = (vector<float,_std::allocator<float>_> *)
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                      ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                       CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *(int *)&(this_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start = 2;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  *piVar1 = 2;
  diy::io::NumPy::write_header<float>(in_stack_fffffffffffffbb0,dim,bounds);
  uVar8 = 0;
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)(local_231 + 1),0);
  diy::io::BOV::write<float>
            (this_01,bounds_00,buffer,(DiscreteBounds *)CONCAT44(uVar6,in_stack_fffffffffffffbc0),
             SUB81(uVar5 >> 0x38,0),(int)uVar5);
  diy::Bounds<int>::~Bounds((Bounds<int> *)CONCAT44(uVar8,in_stack_fffffffffffffb60));
  diy::Bounds<int>::~Bounds((Bounds<int> *)CONCAT44(uVar8,in_stack_fffffffffffffb60));
  diy::io::NumPy::~NumPy((NumPy *)0x10a905);
  diy::mpi::io::file::~file((file *)CONCAT44(uVar8,in_stack_fffffffffffffb60));
  std::vector<float,_std::allocator<float>_>::~vector(this_02);
  diy::io::NumPy::~NumPy((NumPy *)0x10a92c);
  diy::mpi::io::file::~file((file *)CONCAT44(uVar8,in_stack_fffffffffffffb60));
  std::vector<float,_std::allocator<float>_>::~vector(this_02);
  diy::io::BOV::~BOV((BOV *)CONCAT44(uVar8,in_stack_fffffffffffffb60));
  diy::mpi::io::file::~file((file *)CONCAT44(uVar8,in_stack_fffffffffffffb60));
  diy::Bounds<int>::~Bounds((Bounds<int> *)CONCAT44(uVar8,in_stack_fffffffffffffb60));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_02);
  diy::mpi::communicator::~communicator((communicator *)0x10a987);
  diy::mpi::environment::~environment((environment *)0x10a994);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  std::vector<unsigned> shape;
  shape.push_back(16);
  shape.push_back(16);

  diy::DiscreteBounds box(2);
  box.min[0] = box.min[1] = 4;
  box.max[0] = box.max[1] = 7;

  diy::mpi::io::file in(world, "test.bin", diy::mpi::io::file::rdonly);
  diy::io::BOV reader(in, shape);

  std::cout << "Reading" << std::endl;
  std::vector<float> data(16);
  reader.read(box, &data[0]);

  for (unsigned i = 0; i < data.size(); ++i)
    std::cout << data[i] << std::endl;

  std::cout << "---" << std::endl;
  diy::mpi::io::file in2(world, "test.npy", diy::mpi::io::file::rdonly);
  diy::io::NumPy  reader2(in2);
  reader2.read_header();
  std::vector<float> data2(16);
  reader2.read(box, &data2[0]);

  for (unsigned i = 0; i < data2.size(); ++i)
    std::cout << data2[i] << std::endl;

  diy::mpi::io::file out(world, "out.npy", diy::mpi::io::file::wronly | diy::mpi::io::file::create);
  diy::io::NumPy     writer(out);
  diy::DiscreteBounds full_box(2), sub_box(2);
  full_box.min[0] = full_box.min[1] = 0;
  full_box.max[0] = full_box.max[1] = 3;
  sub_box.min[0] = sub_box.min[1] = 1;
  sub_box.max[0] = sub_box.max[1] = 2;
  writer.write_header<float>(2, full_box);
  //writer.write(full_box, &data2[0]);
  writer.write(full_box, &data2[0], sub_box);
}